

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardChars.h
# Opt level: O3

bool __thiscall
UnifiedRegex::StandardChars<char16_t>::ToEquivs
          (StandardChars<char16_t> *this,MappingSource mappingSource,Char c,Char *equivs)

{
  UnicodeDataCaseMapper *this_00;
  code *pcVar1;
  uint k;
  bool bVar2;
  BOOL BVar3;
  unsigned_long uVar4;
  undefined4 *puVar5;
  long lVar6;
  undefined6 in_register_00000012;
  int iVar7;
  undefined7 in_register_00000031;
  Type *pTVar8;
  undefined1 auVar9 [16];
  Type local_38;
  unsigned_long lastOcc;
  
  iVar7 = (int)CONCAT71(in_register_00000031,mappingSource);
  if (iVar7 != 1) {
    if (iVar7 == 0) {
      this_00 = &this->unicodeDataCaseMapper;
      k = (uint)(ushort)c;
      if (k < 0x100) {
        BVar3 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::IsInDirectMap
                          (&this_00->toEquivs,k);
        if (BVar3 == 0) {
          uVar4 = (this->unicodeDataCaseMapper).toEquivs.defv;
        }
        else {
          uVar4 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::GetDirectMap
                            (&this_00->toEquivs,k);
        }
      }
      else {
        bVar2 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
                          (&this_00->toEquivs,k,&local_38);
        pTVar8 = &(this->unicodeDataCaseMapper).toEquivs.defv;
        if (bVar2) {
          pTVar8 = &local_38;
        }
        uVar4 = *pTVar8;
      }
      if (uVar4 == 0xffffffffffffffff) {
        auVar9 = ZEXT416((uint)CONCAT62(in_register_00000012,c));
        auVar9 = pshuflw(auVar9,auVar9,0);
        *(long *)equivs = auVar9._0_8_;
        bVar2 = false;
      }
      else {
        lVar6 = 0;
        do {
          equivs[lVar6] = (Char)uVar4;
          uVar4 = uVar4 >> 0x10;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
        bVar2 = true;
      }
      return bVar2;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/StandardChars.h"
                       ,0x166,"(mappingSource == CaseInsensitive::MappingSource::CaseFolding)",
                       "mappingSource == CaseInsensitive::MappingSource::CaseFolding");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar2 = CaseMapper<UnifiedRegex::CaseMapper<UnifiedRegex::TrivialCaseMapper>_>::ToEquivs
                    (&this->caseFoldingCaseMapper,c,equivs);
  return bVar2;
}

Assistant:

inline bool ToEquivs(CaseInsensitive::MappingSource mappingSource, Char c, __out_ecount(4) Char* equivs) const
        {
            if (mappingSource == CaseInsensitive::MappingSource::UnicodeData)
            {
                return unicodeDataCaseMapper.ToEquivs(c, equivs);
            }
            else
            {
                Assert(mappingSource == CaseInsensitive::MappingSource::CaseFolding);
                return caseFoldingCaseMapper.ToEquivs(c, equivs);
            }
        }